

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

curl_mime * curl_mime_init(Curl_easy *easy)

{
  CURLcode CVar1;
  curl_llist_element *pcVar2;
  curl_mime *mime;
  Curl_easy *easy_local;
  
  easy_local = (Curl_easy *)(*Curl_cmalloc)(0x40);
  if (easy_local != (Curl_easy *)0x0) {
    easy_local->next = easy;
    easy_local->prev = (Curl_easy *)0x0;
    easy_local->easy_conn = (connectdata *)0x0;
    (easy_local->connect_queue).ptr = (void *)0x0;
    pcVar2 = (curl_llist_element *)(*Curl_cmalloc)(0x29);
    (easy_local->connect_queue).prev = pcVar2;
    if ((easy_local->connect_queue).prev == (curl_llist_element *)0x0) {
      (*Curl_cfree)(easy_local);
      easy_local = (Curl_easy *)0x0;
    }
    else {
      memset((easy_local->connect_queue).prev,0x2d,0x18);
      CVar1 = Curl_rand_hex(easy,(uchar *)((easy_local->connect_queue).prev + 1),0x11);
      if (CVar1 == CURLE_OK) {
        mimesetstate((mime_state *)&(easy_local->connect_queue).next,MIMESTATE_BEGIN,(void *)0x0);
      }
      else {
        (*Curl_cfree)((easy_local->connect_queue).prev);
        (*Curl_cfree)(easy_local);
        easy_local = (Curl_easy *)0x0;
      }
    }
  }
  return (curl_mime *)easy_local;
}

Assistant:

curl_mime *curl_mime_init(struct Curl_easy *easy)
{
  curl_mime *mime;

  mime = (curl_mime *) malloc(sizeof(*mime));

  if(mime) {
    mime->easy = easy;
    mime->parent = NULL;
    mime->firstpart = NULL;
    mime->lastpart = NULL;

    /* Get a part boundary. */
    mime->boundary = malloc(24 + MIME_RAND_BOUNDARY_CHARS + 1);
    if(!mime->boundary) {
      free(mime);
      return NULL;
    }

    memset(mime->boundary, '-', 24);
    if(Curl_rand_hex(easy, (unsigned char *) mime->boundary + 24,
                     MIME_RAND_BOUNDARY_CHARS + 1)) {
      /* failed to get random separator, bail out */
      free(mime->boundary);
      free(mime);
      return NULL;
    }
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);
  }

  return mime;
}